

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

size_t CLI::detail::escape_detect(string *str,size_t offset)

{
  int iVar1;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type in_RSI;
  char *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  size_type astart;
  value_type next;
  undefined4 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffdc;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  char cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[](in_stack_ffffffffffffffe0,
                      CONCAT17(in_stack_ffffffffffffffdf,
                               CONCAT16(in_stack_ffffffffffffffde,
                                        CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ))));
  cVar3 = *pvVar2;
  if ((((cVar3 == '\"') || (cVar3 == '\'')) || (cVar3 == '`')) &&
     (this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_last_of(unaff_retaddr,in_RDI,in_RSI),
     this != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff
     )) {
    pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](this,CONCAT17(in_stack_ffffffffffffffdf,
                                      CONCAT16(in_stack_ffffffffffffffde,
                                               CONCAT24(in_stack_ffffffffffffffdc,
                                                        in_stack_ffffffffffffffd8))));
    iVar1 = (int)*pvVar2;
    pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](this,CONCAT17(in_stack_ffffffffffffffdf,
                                      CONCAT16(in_stack_ffffffffffffffde,
                                               CONCAT24(in_stack_ffffffffffffffdc,iVar1))));
    cVar3 = '-';
    if (*pvVar2 != '=') {
      cVar3 = '/';
    }
    if (iVar1 == cVar3) {
      pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](this,CONCAT17(cVar3,CONCAT16(0x2f,CONCAT24(in_stack_ffffffffffffffdc,iVar1
                                                                    ))));
      *pvVar2 = ' ';
    }
  }
  return in_RSI + 1;
}

Assistant:

CLI11_INLINE std::size_t escape_detect(std::string &str, std::size_t offset) {
    auto next = str[offset + 1];
    if((next == '\"') || (next == '\'') || (next == '`')) {
        auto astart = str.find_last_of("-/ \"\'`", offset - 1);
        if(astart != std::string::npos) {
            if(str[astart] == ((str[offset] == '=') ? '-' : '/'))
                str[offset] = ' ';  // interpret this as a space so the split_up works properly
        }
    }
    return offset + 1;
}